

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O3

void __thiscall Stack::Stack(Stack *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_JsonProtocol)._vptr_JsonProtocol = (_func_int **)&PTR__Stack_0017edc0;
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  (this->file)._M_string_length = 0;
  (this->file).field_2._M_local_buf[0] = '\0';
  (this->functionName)._M_dataplus._M_p = (pointer)&(this->functionName).field_2;
  (this->functionName)._M_string_length = 0;
  (this->functionName).field_2._M_local_buf[0] = '\0';
  this->level = 0;
  this->line = 0;
  (this->localVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->upvalueVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->upvalueVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upvalueVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017f190;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  (this->variableArena).super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (this->variableArena).super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

Stack::Stack()
	: level(0), line(0), variableArena(std::make_shared<Arena<Variable>>()) {
}